

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O1

Error asmjit::X86Logging_formatImmText
                (StringBuilder *sb,uint32_t u8,uint32_t bits,uint32_t advance,char *text,
                uint32_t count)

{
  char cVar1;
  Error EVar2;
  Error EVar3;
  int iVar4;
  int iVar5;
  char *str;
  uint uVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  
  EVar2 = StringBuilder::_opChar(sb,1,'<');
  if (EVar2 == 0) {
    bVar8 = count != 0;
    if (bVar8) {
      uVar6 = 0;
      iVar7 = 0;
      do {
        if ((uVar6 == 0) || (EVar3 = StringBuilder::_opChar(sb,1,'|'), EVar3 == 0)) {
          iVar4 = (u8 & ~(-1 << (bits & 0x1f))) + iVar7;
          str = text;
          if (iVar4 != 0) {
            iVar5 = 0;
            do {
              do {
                cVar1 = *str;
                str = str + 1;
              } while (cVar1 != '\0');
              iVar5 = iVar5 + 1;
            } while (iVar5 != iVar4);
          }
          EVar3 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
          bVar9 = EVar3 == 0;
          if (!bVar9) {
            EVar2 = EVar3;
          }
        }
        else {
          bVar9 = false;
          EVar2 = EVar3;
        }
        if (!bVar9) break;
        uVar6 = uVar6 + 1;
        u8 = u8 >> (bits & 0x1f);
        iVar7 = iVar7 + advance;
        bVar8 = uVar6 < count;
      } while (uVar6 != count);
    }
    if (!bVar8) {
      EVar2 = StringBuilder::_opChar(sb,1,'>');
      return EVar2;
    }
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmText(StringBuilder& sb, uint32_t u8, uint32_t bits, uint32_t advance, const char* text, uint32_t count = 1) noexcept {
  ASMJIT_PROPAGATE(sb.appendChar('<'));

  uint32_t mask = (1 << bits) - 1;
  uint32_t pos = 0;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits, pos += advance) {
    uint32_t value = (u8 & mask) + pos;
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendChar('|'));
    ASMJIT_PROPAGATE(sb.appendString(Utils::findPackedString(text, value)));
  }

  return sb.appendChar('>');
}